

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O2

int lua_dump(lua_State *L,lua_Writer writer,void *data)

{
  int iVar1;
  ulong uVar2;
  
  if ((*(int *)((long)L->top + -4) == -9) &&
     (uVar2 = (ulong)L->top[-1].u32.lo, *(char *)(uVar2 + 6) == '\0')) {
    iVar1 = lj_bcwrite(L,(GCproto *)((ulong)*(uint *)(uVar2 + 0x10) - 0x40),writer,data,0);
    return iVar1;
  }
  return 1;
}

Assistant:

LUA_API int lua_dump(lua_State *L, lua_Writer writer, void *data)
{
  cTValue *o = L->top-1;
  api_check(L, L->top > L->base);
  if (tvisfunc(o) && isluafunc(funcV(o)))
    return lj_bcwrite(L, funcproto(funcV(o)), writer, data, 0);
  else
    return 1;
}